

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

bool tinyusdz::anon_unknown_240::OverrideCustomDataRec
               (uint32_t depth,CustomDataType *dst,CustomDataType *src,bool override_existing)

{
  _Base_ptr __k;
  bool bVar1;
  const_iterator cVar2;
  mapped_type *pmVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  *dst_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  *src_00;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  bool bVar6;
  
  if (depth < 0x8000001) {
    p_Var4 = (src->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &(src->_M_t)._M_impl.super__Rb_tree_header;
    bVar6 = (_Rb_tree_header *)p_Var4 == p_Var5;
    if (!bVar6) {
      do {
        __k = p_Var4 + 1;
        cVar2 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                ::find(&dst->_M_t,(key_type *)__k);
        if ((_Rb_tree_header *)cVar2._M_node == &(dst->_M_t)._M_impl.super__Rb_tree_header) {
          ::std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::MetaVariable_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>
                      *)dst,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k
                     ,(MetaVariable *)(p_Var4 + 2));
        }
        else if (override_existing) {
          pmVar3 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                   ::at(dst,(key_type *)__k);
          dst_00 = tinyusdz::value::Value::
                   as<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                             (&pmVar3->_value,false);
          src_00 = tinyusdz::value::Value::
                   as<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                             ((Value *)(p_Var4 + 2),false);
          if (dst_00 == (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                         *)0x0 ||
              src_00 == (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                         *)0x0) {
            pmVar3 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                     ::operator[](dst,(key_type *)__k);
            ::std::__cxx11::string::_M_assign((string *)&pmVar3->_name);
            linb::any::operator=((any *)pmVar3,(any *)(p_Var4 + 2));
          }
          else {
            bVar1 = OverrideCustomDataRec(depth + 1,dst_00,src_00,true);
            if (!bVar1) {
              return bVar6;
            }
          }
        }
        p_Var4 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
        bVar6 = (_Rb_tree_header *)p_Var4 == p_Var5;
      } while (!bVar6);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool OverrideCustomDataRec(uint32_t depth, CustomDataType &dst,
                           const CustomDataType &src, const bool override_existing) {
  if (depth > (1024 * 1024 * 128)) {
    // too deep
    return false;
  }

  for (const auto &item : src) {
    if (dst.count(item.first)) {
      if (override_existing) {
        CustomDataType *dst_dict =
            dst.at(item.first).get_raw_value().as<CustomDataType>();

        const value::Value &src_data = item.second.get_raw_value();
        const CustomDataType *src_dict = src_data.as<CustomDataType>();

        //
        // Recursively apply override op both types are dict.
        //
        if (src_dict && dst_dict) {
          // recursively override dict
          if (!OverrideCustomDataRec(depth + 1, (*dst_dict), (*src_dict), override_existing)) {
            return false;
          }

        } else {
          dst[item.first] = item.second;
        }
      }
    } else {
      // add dict value
      dst.emplace(item.first, item.second);
    }
  }

  return true;
}